

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSContext * JS_NewContextRaw(JSRuntime *rt)

{
  JSMallocState *pJVar1;
  list_head *plVar2;
  list_head *plVar3;
  JSValueUnion JVar4;
  JSRefCountHeader *p;
  JSContext *ctx;
  JSValue *pJVar5;
  long lVar6;
  JSShape *pJVar7;
  int prop_size;
  long lVar8;
  JSObject *proto;
  JSRefCountHeader *p_1;
  JSValue JVar9;
  JSValue JVar10;
  
  pJVar1 = &rt->malloc_state;
  ctx = (JSContext *)(*(rt->mf).js_malloc)(pJVar1,0x1c0);
  if (ctx != (JSContext *)0x0) {
    memset(&(ctx->header).dummy1,0,0x1bb);
    (ctx->header).ref_count = 1;
    (ctx->header).field_0x4 = 5;
    plVar3 = &(ctx->header).link;
    plVar2 = (rt->gc_obj_list).prev;
    plVar2->next = plVar3;
    (ctx->header).link.prev = plVar2;
    (ctx->header).link.next = &rt->gc_obj_list;
    (rt->gc_obj_list).prev = plVar3;
    pJVar5 = (JSValue *)(*(rt->mf).js_malloc)(pJVar1,(long)rt->class_count << 4);
    ctx->class_proto = pJVar5;
    if (pJVar5 != (JSValue *)0x0) {
      ctx->rt = rt;
      plVar3 = (rt->context_list).prev;
      plVar3->next = &ctx->link;
      (ctx->link).prev = plVar3;
      (ctx->link).next = &rt->context_list;
      (rt->context_list).prev = &ctx->link;
      if (0 < rt->class_count) {
        lVar6 = 8;
        lVar8 = 0;
        do {
          pJVar5 = ctx->class_proto;
          *(undefined4 *)((long)pJVar5 + lVar6 + -8) = 0;
          *(undefined8 *)((long)&pJVar5->u + lVar6) = 2;
          lVar8 = lVar8 + 1;
          lVar6 = lVar6 + 0x10;
        } while (lVar8 < rt->class_count);
        pJVar5 = ctx->class_proto;
      }
      (ctx->array_ctor).u.int32 = 0;
      (ctx->array_ctor).tag = 2;
      (ctx->regexp_ctor).u.int32 = 0;
      (ctx->regexp_ctor).tag = 2;
      (ctx->promise_ctor).u.int32 = 0;
      (ctx->promise_ctor).tag = 2;
      (ctx->loaded_modules).prev = &ctx->loaded_modules;
      (ctx->loaded_modules).next = &ctx->loaded_modules;
      JVar9 = JS_NewObjectProtoClass(ctx,(JSValue)(ZEXT816(2) << 0x40),1);
      pJVar5[1] = JVar9;
      JVar9 = JS_NewCFunction3(ctx,js_function_proto,"",0,JS_CFUNC_generic,0,ctx->class_proto[1]);
      ctx->function_proto = JVar9;
      pJVar5 = ctx->class_proto;
      if (0xfffffff4 < (uint)JVar9.tag) {
        *(int *)JVar9.u.ptr = *JVar9.u.ptr + 1;
      }
      pJVar5[0xd] = JVar9;
      pJVar5 = ctx->class_proto;
      JVar9 = JS_NewObjectProtoClass(ctx,pJVar5[1],1);
      pJVar5[3] = JVar9;
      JS_SetPropertyFunctionList(ctx,ctx->class_proto[3],js_error_proto_funcs,3);
      lVar6 = 0;
      do {
        JVar9 = JS_NewObjectProtoClass(ctx,ctx->class_proto[3],1);
        JVar10 = JS_NewAtomString(ctx,*(char **)((long)native_error_name + lVar6));
        JS_DefinePropertyValue(ctx,JVar9,0x36,JVar10,3);
        JVar4 = (JSValueUnion)((JSValueUnion *)(ctx->rt->atom_array + 0x2f))->ptr;
        *(int *)JVar4.ptr = *JVar4.ptr + 1;
        JVar10.tag = -7;
        JVar10.u.ptr = JVar4.ptr;
        JS_DefinePropertyValue(ctx,JVar9,0x33,JVar10,3);
        *(JSValueUnion *)((long)&ctx->native_error_proto[0].u + lVar6 * 2) = JVar9.u;
        *(int64_t *)((long)&ctx->native_error_proto[0].tag + lVar6 * 2) = JVar9.tag;
        lVar6 = lVar6 + 8;
      } while (lVar6 != 0x40);
      pJVar5 = ctx->class_proto;
      prop_size = 2;
      JVar9 = JS_NewObjectProtoClass(ctx,pJVar5[1],2);
      pJVar5[2] = JVar9;
      proto = (JSObject *)0x0;
      if ((int)ctx->class_proto[2].tag == -1) {
        proto = (JSObject *)ctx->class_proto[2].u.ptr;
      }
      pJVar7 = js_new_shape2(ctx,proto,1,prop_size);
      ctx->array_shape = pJVar7;
      add_shape_property(ctx,&ctx->array_shape,(JSObject *)0x0,0x30,10);
      return ctx;
    }
    (*(rt->mf).js_free)(pJVar1,ctx);
  }
  return (JSContext *)0x0;
}

Assistant:

JSContext *JS_NewContextRaw(JSRuntime *rt)
{
    JSContext *ctx;
    int i;

    ctx = js_mallocz_rt(rt, sizeof(JSContext));
    if (!ctx)
        return NULL;
    ctx->header.ref_count = 1;
    add_gc_object(rt, &ctx->header, JS_GC_OBJ_TYPE_JS_CONTEXT);

    ctx->class_proto = js_malloc_rt(rt, sizeof(ctx->class_proto[0]) *
                                    rt->class_count);
    if (!ctx->class_proto) {
        js_free_rt(rt, ctx);
        return NULL;
    }
    ctx->rt = rt;
    list_add_tail(&ctx->link, &rt->context_list);
#ifdef CONFIG_BIGNUM
    ctx->bf_ctx = &rt->bf_ctx;
    ctx->fp_env.prec = 113;
    ctx->fp_env.flags = bf_set_exp_bits(15) | BF_RNDN | BF_FLAG_SUBNORMAL;
#endif
    for(i = 0; i < rt->class_count; i++)
        ctx->class_proto[i] = JS_NULL;
    ctx->array_ctor = JS_NULL;
    ctx->regexp_ctor = JS_NULL;
    ctx->promise_ctor = JS_NULL;
    init_list_head(&ctx->loaded_modules);

    JS_AddIntrinsicBasicObjects(ctx);
    return ctx;
}